

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O3

Bitmap * __thiscall lunasvg::Bitmap::operator=(Bitmap *this,Bitmap *bitmap)

{
  plutovg_surface_t *surface;
  plutovg_surface *__tmp;
  plutovg_surface_t *ppVar1;
  
  ppVar1 = plutovg_surface_reference(bitmap->m_surface);
  surface = this->m_surface;
  this->m_surface = ppVar1;
  plutovg_surface_destroy(surface);
  return this;
}

Assistant:

Bitmap& Bitmap::operator=(const Bitmap& bitmap)
{
    Bitmap(bitmap).swap(*this);
    return *this;
}